

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvalNN.cpp
# Opt level: O0

bool read_input(NaDataFile *df,uint vec_len,NaReal *vec)

{
  int iVar1;
  ulong uVar2;
  long in_RDX;
  uint in_ESI;
  long *in_RDI;
  undefined8 uVar3;
  uint vec_i;
  uint local_24;
  
  if (in_RDI == (long *)0x0) {
    for (local_24 = 0; local_24 < in_ESI; local_24 = local_24 + 1) {
      iVar1 = __isoc99_scanf("%lg",in_RDX + (ulong)local_24 * 8);
      if (iVar1 != 1) {
        return false;
      }
    }
  }
  else {
    if (read_input::bFirst) {
      read_input::bFirst = false;
      uVar2 = (**(code **)(*in_RDI + 0x28))();
      if ((uVar2 & 1) == 0) {
        return false;
      }
    }
    else {
      uVar2 = (**(code **)(*in_RDI + 0x20))();
      if ((uVar2 & 1) == 0) {
        return false;
      }
    }
    for (local_24 = 0; local_24 < in_ESI; local_24 = local_24 + 1) {
      uVar3 = (**(code **)(*in_RDI + 0x18))(in_RDI,local_24);
      *(undefined8 *)(in_RDX + (ulong)local_24 * 8) = uVar3;
    }
  }
  return true;
}

Assistant:

bool
read_input (NaDataFile* df, unsigned vec_len, NaReal* vec)
{
  static bool	bFirst = true;
  unsigned	vec_i;

  if(NULL == df)
    {
      /* read stdin */
      for(vec_i = 0; vec_i < vec_len; ++vec_i)
	if(1 != scanf("%lg", vec + vec_i))
	  return false;
    }
  else
    {
      /* read data file */
      if(bFirst)
	{
	  bFirst = false;
	  if(!df->GoStartRecord())
	    return false;
	}
      else if(!df->GoNextRecord())
	return false;

      for(vec_i = 0; vec_i < vec_len; ++vec_i)
	vec[vec_i] = df->GetValue(vec_i);
    }

  return true;
}